

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v8::detail::write_nonfinite<char,fmt::v8::appender>
          (detail *this,appender out,bool isinf,basic_format_specs<char> specs,float_specs *fspecs)

{
  size_t sVar1;
  char *pcVar2;
  appender aVar3;
  undefined7 in_register_00000011;
  bool local_91;
  char *local_90;
  char *local_88;
  char *local_80;
  anon_class_16_2_632e021f local_78;
  char local_68;
  undefined2 uStack_67;
  fill_t<char> fStack_65;
  bool local_59;
  size_t sStack_58;
  bool is_zero_fill;
  size_t size;
  undefined8 uStack_48;
  sign_t sign;
  size_t str_size;
  char *str;
  float_specs *fspecs_local;
  undefined1 auStack_28 [7];
  bool isinf_local;
  basic_format_specs<char> specs_local;
  appender out_local;
  
  register0x00000011 = in_register_00000011;
  auStack_28[0] = isinf;
  str = specs._8_8_;
  specs_local._0_8_ = specs._0_8_;
  fspecs_local._7_1_ =
       (byte)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container & 1;
  if (((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container & 1) == 0) {
    if ((*(uint *)(str + 4) >> 0x10 & 1) == 0) {
      local_90 = "nan";
    }
    else {
      local_90 = "NAN";
    }
    local_88 = local_90;
  }
  else {
    if ((*(uint *)(str + 4) >> 0x10 & 1) == 0) {
      local_80 = "inf";
    }
    else {
      local_80 = "INF";
    }
    local_88 = local_80;
  }
  str_size = (size_t)local_88;
  uStack_48 = 3;
  size._4_4_ = *(uint *)(str + 4) >> 8 & 0xff;
  sStack_58 = (long)(int)(uint)(size._4_4_ != none) + 3;
  specs_local._8_8_ = this;
  sVar1 = fill_t<char>::size((fill_t<char> *)((long)&specs_local.width + 3));
  local_91 = false;
  if (sVar1 == 1) {
    pcVar2 = fill_t<char>::data((fill_t<char> *)((long)&specs_local.width + 3));
    local_91 = *pcVar2 == '0';
  }
  local_59 = local_91;
  if (local_91 != false) {
    pcVar2 = fill_t<char>::operator[]((fill_t<char> *)((long)&specs_local.width + 3),0);
    *pcVar2 = ' ';
  }
  local_68 = specs_local.type;
  uStack_67 = specs_local._9_2_;
  fStack_65 = specs_local.fill;
  local_78.sign = size._4_4_;
  local_78.str = (char *)str_size;
  aVar3 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write_nonfinite<char,fmt::v8::appender>(fmt::v8::appender,bool,fmt::v8::basic_format_specs<char>,fmt::v8::detail::float_specs_const&)::_lambda(fmt::v8::appender)_1_>
                    ((appender)specs_local._8_8_,(basic_format_specs<char> *)auStack_28,sStack_58,
                     &local_78);
  return (appender)
         aVar3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_nonfinite(OutputIt out, bool isinf, basic_format_specs<Char> specs,
                     const float_specs& fspecs) -> OutputIt {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  // Replace '0'-padding with space for non-finite values.
  const bool is_zero_fill =
      specs.fill.size() == 1 && *specs.fill.data() == static_cast<Char>('0');
  if (is_zero_fill) specs.fill[0] = static_cast<Char>(' ');
  return write_padded(out, specs, size, [=](reserve_iterator<OutputIt> it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}